

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

string * __thiscall
trieste::utf8::escape_unicode_abi_cxx11_
          (string *__return_storage_ptr__,utf8 *this,string_view *input)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  ostream *poVar3;
  ulong __pos;
  undefined8 uStack_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  pair<trieste::utf8::rune,_std::basic_string_view<char,_std::char_traits<char>_>_> local_1c0;
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  __pos = 0;
  do {
    if (*(ulong *)this <= __pos) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
      return __return_storage_ptr__;
    }
    local_1d0 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)this,__pos,
                           0xffffffffffffffff);
    utf8_to_rune(&local_1c0,(string_view *)&local_1d0,false);
    if (local_1c0.first.value < 0x8000) {
      if (0x7f < local_1c0.first.value) {
        poVar3 = std::operator<<((ostream *)&os,"\\u");
        *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) | 0x4000;
        poVar3 = std::operator<<(poVar3,0x30);
        uStack_1e0 = 4;
        goto LAB_00165d6a;
      }
      std::operator<<((ostream *)&os,(char)local_1c0.first.value);
    }
    else {
      poVar3 = std::operator<<((ostream *)&os,"\\U");
      *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) | 0x4000;
      poVar3 = std::operator<<(poVar3,0x30);
      uStack_1e0 = 8;
LAB_00165d6a:
      pp_Var1 = poVar3->_vptr_basic_ostream;
      *(undefined8 *)(&poVar3->field_0x10 + (long)pp_Var1[-3]) = uStack_1e0;
      p_Var2 = pp_Var1[-3];
      *(uint *)(&poVar3->field_0x18 + (long)p_Var2) =
           *(uint *)(&poVar3->field_0x18 + (long)p_Var2) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    }
    __pos = __pos + local_1c0.second._M_len;
  } while( true );
}

Assistant:

inline std::string escape_unicode(const std::string_view& input)
    {
      std::ostringstream os;
      std::size_t pos = 0;
      while (pos < input.size())
      {
        auto [r, s] = utf8_to_rune(input.substr(pos), false);
        if (r.value > 0x7FFF)
        {
          os << "\\U" << std::uppercase << std::setfill('0') << std::setw(8)
             << std::hex << r.value;
        }
        else if (r.value > 0x7F)
        {
          os << "\\u" << std::uppercase << std::setfill('0') << std::setw(4)
             << std::hex << r.value;
        }
        else
        {
          os << (char)r.value;
        }
        pos += s.size();
      }

      return os.str();
    }